

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O0

idx_t duckdb::DistinctSelectFlatLoop<float,float,duckdb::DistinctFrom,true,false,true,true,false>
                (float *ldata,float *rdata,SelectionVector *sel,idx_t count,ValidityMask *lmask,
                ValidityMask *rmask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  bool bVar2;
  SelectionVector *this;
  float *in_RCX;
  SelectionVector *in_RDX;
  bool comparison_result;
  bool rnull;
  bool lnull;
  idx_t ridx;
  idx_t lidx;
  idx_t result_idx;
  idx_t i;
  idx_t false_count;
  idx_t true_count;
  float *right;
  TemplatedValidityMask<unsigned_long> *this_00;
  undefined8 local_48;
  undefined8 local_38;
  
  local_38 = 0;
  for (local_48 = (float *)0x0; local_48 < in_RCX; local_48 = (float *)((long)local_48 + 1)) {
    this = (SelectionVector *)SelectionVector::get_index(in_RDX,(idx_t)local_48);
    this_00 = (TemplatedValidityMask<unsigned_long> *)0x0;
    right = local_48;
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)0x0,(idx_t)local_48);
    bVar1 = (bool)((bVar1 ^ 0xffU) & 1);
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,(idx_t)right);
    bVar1 = DistinctFrom::Operation<float>((float *)this_00,right,bVar1,(bool)((bVar2 ^ 0xffU) & 1))
    ;
    SelectionVector::set_index(this,(idx_t)this_00,(idx_t)right);
    local_38 = bVar1 + local_38;
  }
  return local_38;
}

Assistant:

static inline idx_t DistinctSelectFlatLoop(LEFT_TYPE *__restrict ldata, RIGHT_TYPE *__restrict rdata,
                                           const SelectionVector *sel, idx_t count, ValidityMask &lmask,
                                           ValidityMask &rmask, SelectionVector *true_sel, SelectionVector *false_sel) {
	idx_t true_count = 0, false_count = 0;
	for (idx_t i = 0; i < count; i++) {
		idx_t result_idx = sel->get_index(i);
		idx_t lidx = LEFT_CONSTANT ? 0 : i;
		idx_t ridx = RIGHT_CONSTANT ? 0 : i;
		const bool lnull = !lmask.RowIsValid(lidx);
		const bool rnull = !rmask.RowIsValid(ridx);
		bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx], lnull, rnull);
		if (HAS_TRUE_SEL) {
			true_sel->set_index(true_count, result_idx);
			true_count += comparison_result;
		}
		if (HAS_FALSE_SEL) {
			false_sel->set_index(false_count, result_idx);
			false_count += !comparison_result;
		}
	}
	if (HAS_TRUE_SEL) {
		return true_count;
	} else {
		return count - false_count;
	}
}